

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceTest.cpp
# Opt level: O2

void __thiscall
StackTraceTest_demangler_Test::~StackTraceTest_demangler_Test(StackTraceTest_demangler_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(StackTraceTest, demangler)
{
    const char *expectedSymbol =
#if defined(__linux__)
        "void testing::internal::HandleSehExceptionsInMethodIfSupported<testing::Test, void>(testing::Test*, void (testing::Test::*)(), char const*)";
#elif defined(__FreeBSD__)
        "void testing::internal::HandleSehExceptionsInMethodIfSupported<testing::Test, void>(testing::Test*, testing::internal::HandleSehExceptionsInMethodIfSupported<testing::Test, void>(void::*)(void), char const*)";
#endif
    CppDemangler demangler;
    const char *demangledSymbol = demangler.demangle("_ZN7testing8internal38HandleSehExceptionsInMethodIfSupportedINS_4TestEvEET0_PT_MS4_FS3_vEPKc");
    EXPECT_STREQ(expectedSymbol, demangledSymbol);
}